

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::AssetPath> *value)

{
  bool bVar1;
  AssetPath v;
  AssetPath local_58;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::AssetPath>::reset(value);
    bVar1 = true;
  }
  else {
    local_58.asset_path_._M_dataplus._M_p = (pointer)&local_58.asset_path_.field_2;
    local_58.asset_path_._M_string_length = 0;
    local_58.asset_path_.field_2._M_local_buf[0] = '\0';
    local_58.resolved_path_._M_dataplus._M_p = (pointer)&local_58.resolved_path_.field_2;
    local_58.resolved_path_._M_string_length = 0;
    local_58.resolved_path_.field_2._M_local_buf[0] = '\0';
    bVar1 = ReadBasicType(this,&local_58);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::AssetPath>::operator=(value,&local_58);
    }
    tinyusdz::value::AssetPath::~AssetPath(&local_58);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::AssetPath> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::AssetPath v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}